

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_K,_8L,_8L,_(ggml_type)15>::~tensor_traits
          (tensor_traits<block_q4_K,_8L,_8L,_(ggml_type)15> *this)

{
  void *in_RDI;
  
  ~tensor_traits((tensor_traits<block_q4_K,_8L,_8L,_(ggml_type)15> *)0x143078);
  operator_delete(in_RDI,8);
  return;
}

Assistant:

bool work_size(int /* n_threads */, const struct ggml_tensor * op, size_t & size) override {
        // not realy a GGML_TYPE_Q8_0 but same size.
        switch (op->op) {
            case GGML_OP_MUL_MAT:
                size = ggml_row_size(PARAM_TYPE, ggml_nelements(op->src[1]));
                return true;
            case GGML_OP_MUL_MAT_ID:
                size = ggml_row_size(PARAM_TYPE, ggml_nelements(op->src[1]));
                size = GGML_PAD(size, sizeof(int64_t));  // + padding for next bloc.
                size += sizeof(int64_t) * (1+op->src[0]->ne[2]) * op->src[1]->ne[2];
                return true;
            default:
                // GGML_ABORT("fatal error");
                break;
        }
        return false;
    }